

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.c
# Opt level: O2

stumpless_entry * stumpless_add_element(stumpless_entry *entry,stumpless_element *element)

{
  stumpless_entry *psVar1;
  char *message;
  
  if (entry == (stumpless_entry *)0x0) {
    message = "entry was NULL";
  }
  else {
    if (element != (stumpless_element *)0x0) {
      clear_error();
      lock_entry(entry);
      psVar1 = locked_add_element(entry,element);
      unlock_entry(entry);
      return psVar1;
    }
    message = "element was NULL";
  }
  raise_argument_empty(message);
  return (stumpless_entry *)0x0;
}

Assistant:

struct stumpless_entry *
stumpless_add_element( struct stumpless_entry *entry,
                       struct stumpless_element *element ) {
  struct stumpless_entry *result;

  VALIDATE_ARG_NOT_NULL( entry );
  VALIDATE_ARG_NOT_NULL( element );

  clear_error(  );

  lock_entry( entry );
  result = locked_add_element( entry, element );
  unlock_entry( entry );

  return result;
}